

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

ImageDataFunctionHeader * __thiscall
lrit::getHeader<lrit::ImageDataFunctionHeader>
          (ImageDataFunctionHeader *__return_storage_ptr__,lrit *this,Buffer *b,int pos)

{
  undefined4 in_register_0000000c;
  HeaderReader<lrit::ImageDataFunctionHeader> r;
  HeaderReader<lrit::ImageDataFunctionHeader> local_48;
  
  local_48.p_ = (int)b;
  local_48.h_.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.h_.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.h_.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.b_ = (Buffer *)this;
  HeaderReader<lrit::ImageDataFunctionHeader>::getHeader(__return_storage_ptr__,&local_48);
  HeaderReader<lrit::ImageDataFunctionHeader>::read
            (&local_48,(int)__return_storage_ptr__ + 8,
             (void *)((ulong)__return_storage_ptr__->headerLength - 3),
             CONCAT44(in_register_0000000c,pos));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_48.h_.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

ImageDataFunctionHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<ImageDataFunctionHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.data, h.headerLength - 3);
  return h;
}